

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmArgumentParser.h
# Opt level: O0

cmArgumentParser<(anonymous_namespace)::Result> * __thiscall
cmArgumentParser<(anonymous_namespace)::Result>::Bind
          (cmArgumentParser<(anonymous_namespace)::Result> *this,static_string_view name,
          function<ArgumentParser::Continue_((anonymous_namespace)::Result_&,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
          *f,ExpectAtLeast expect)

{
  string_view name_00;
  anon_class_40_2_bca52434 local_90;
  KeywordAction local_68;
  size_t local_48;
  char *pcStack_40;
  function<ArgumentParser::Continue_((anonymous_namespace)::Result_&,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
  *local_30;
  function<ArgumentParser::Continue_((anonymous_namespace)::Result_&,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
  *f_local;
  cmArgumentParser<(anonymous_namespace)::Result> *this_local;
  ExpectAtLeast expect_local;
  static_string_view name_local;
  
  pcStack_40 = name.super_string_view._M_str;
  local_48 = name.super_string_view._M_len;
  local_30 = f;
  f_local = (function<ArgumentParser::Continue_((anonymous_namespace)::Result_&,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
             *)this;
  this_local = (cmArgumentParser<(anonymous_namespace)::Result> *)expect.Count;
  expect_local.Count = local_48;
  std::
  function<ArgumentParser::Continue_((anonymous_namespace)::Result_&,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
  ::function(&local_90.f,f);
  local_90.expect.Count = (size_t)this_local;
  std::function<void(ArgumentParser::Instance&)>::
  function<cmArgumentParser<(anonymous_namespace)::Result>::Bind(cm::static_string_view,std::function<ArgumentParser::Continue((anonymous_namespace)::Result&,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>)>,ArgumentParser::ExpectAtLeast)::_lambda(ArgumentParser::Instance&)_1_,void>
            ((function<void(ArgumentParser::Instance&)> *)&local_68,&local_90);
  name_00._M_str = pcStack_40;
  name_00._M_len = local_48;
  ArgumentParser::Base::Bind(&this->super_Base,name_00,&local_68);
  std::function<void_(ArgumentParser::Instance_&)>::~function(&local_68);
  Bind(cm::static_string_view,std::function<ArgumentParser::Continue((anonymous_namespace)::Result&,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>)>,ArgumentParser::ExpectAtLeast)
  ::{lambda(ArgumentParser::Instance&)#1}::~Instance
            ((_lambda_ArgumentParser__Instance___1_ *)&local_90);
  return this;
}

Assistant:

cmArgumentParser& Bind(
    cm::static_string_view name,
    std::function<Continue(Result&, cm::string_view, cm::string_view)> f,
    ExpectAtLeast expect = { 1 })
  {
    this->Base::Bind(name, [f, expect](Instance& instance) {
      Result* result = static_cast<Result*>(instance.Result);
      cm::string_view keyword = instance.Keyword;
      instance.Bind(
        [result, keyword, &f](cm::string_view arg) -> Continue {
          return f(*result, keyword, arg);
        },
        expect);
    });
    return *this;
  }